

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdarg.c
# Opt level: O1

int test(int s,...)

{
  longdouble lVar1;
  code *pcVar2;
  longdouble lVar3;
  char in_AL;
  int iVar4;
  longdouble *plVar5;
  void **ppvVar6;
  undefined8 in_RCX;
  ulong uVar7;
  undefined8 in_RDX;
  char *pcVar8;
  undefined8 in_RSI;
  undefined8 uVar9;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined8 local_118;
  void **local_110;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  lVar3 = _DAT_00102010;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_110 = &ap[0].overflow_arg_area;
  local_118 = 0x3000000008;
  local_e8[1] = (void *)in_RSI;
  local_e8[2] = (void *)in_RDX;
  local_e8[3] = (void *)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  do {
    do {
    } while (8 < (uint)s);
    switch(s) {
    case 0:
      return (&switchD_001012bb::switchdataD_00102028)[(uint)s] + 0x102028;
    case 1:
      uVar7 = local_118 & 0xffffffff;
      if (uVar7 < 0x29) {
        local_118 = CONCAT44(local_118._4_4_,(int)local_118 + 8);
        ppvVar6 = (void **)((long)local_e8 + uVar7);
      }
      else {
        ppvVar6 = local_110;
        local_110 = local_110 + 1;
      }
      if (*(int *)ppvVar6 != 0x7fffffff) {
        TEST_RESULTS = TEST_RESULTS + 1;
        uVar9 = 0x2b;
        pcVar8 = "va_arg( ap, int ) == INT_MAX";
LAB_00101570:
        printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/stdarg.c, line %d - %s\n"
               ,uVar9,pcVar8);
      }
      break;
    case 2:
      uVar7 = local_118 & 0xffffffff;
      if (uVar7 < 0x29) {
        local_118 = CONCAT44(local_118._4_4_,(int)local_118 + 8);
        ppvVar6 = (void **)((long)local_e8 + uVar7);
      }
      else {
        ppvVar6 = local_110;
        local_110 = local_110 + 1;
      }
      if (*ppvVar6 != (void *)0x7fffffffffffffff) {
        TEST_RESULTS = TEST_RESULTS + 1;
        uVar9 = 0x32;
        pcVar8 = "va_arg( ap, long ) == LONG_MAX";
        goto LAB_00101570;
      }
      break;
    case 3:
      uVar7 = local_118 & 0xffffffff;
      if (uVar7 < 0x29) {
        local_118 = CONCAT44(local_118._4_4_,(int)local_118 + 8);
        ppvVar6 = (void **)((long)local_e8 + uVar7);
      }
      else {
        ppvVar6 = local_110;
        local_110 = local_110 + 1;
      }
      if (*ppvVar6 != (void *)0x7fffffffffffffff) {
        TEST_RESULTS = TEST_RESULTS + 1;
        uVar9 = 0x39;
        pcVar8 = "va_arg( ap, long long ) == LLONG_MAX";
        goto LAB_00101570;
      }
      break;
    case 4:
      uVar7 = (ulong)local_118._4_4_;
      if (uVar7 < 0xa1) {
        local_118 = CONCAT44(local_118._4_4_ + 0x10,(int)local_118);
        ppvVar6 = (void **)((long)local_e8 + uVar7);
      }
      else {
        ppvVar6 = local_110;
        local_110 = local_110 + 1;
      }
      if (((double)*ppvVar6 != 1.79769313486232e+308) || (NAN((double)*ppvVar6))) {
        TEST_RESULTS = TEST_RESULTS + 1;
        uVar9 = 0x40;
        pcVar8 = "va_arg( ap, double ) == DBL_MAX";
        goto LAB_00101570;
      }
      break;
    case 5:
      plVar5 = (longdouble *)((ulong)((long)local_110 + 0xfU) & 0xfffffffffffffff0);
      local_110 = (void **)(plVar5 + 1);
      lVar1 = *plVar5;
      if ((lVar1 != lVar3) || (NAN(lVar1) || NAN(lVar3))) {
        TEST_RESULTS = TEST_RESULTS + 1;
        uVar9 = 0x47;
        pcVar8 = "va_arg( ap, long double ) == LDBL_MAX";
        goto LAB_00101570;
      }
      break;
    case 6:
      uVar7 = local_118 & 0xffffffff;
      if (uVar7 < 0x29) {
        local_118 = CONCAT44(local_118._4_4_,(int)local_118 + 8);
        ppvVar6 = (void **)((long)local_e8 + uVar7);
      }
      else {
        ppvVar6 = local_110;
        local_110 = local_110 + 1;
      }
      if (**ppvVar6 != 0x7fffffff) {
        TEST_RESULTS = TEST_RESULTS + 1;
        uVar9 = 0x4e;
        pcVar8 = "*( va_arg( ap, int * ) ) == INT_MAX";
        goto LAB_00101570;
      }
      break;
    case 7:
      uVar7 = local_118 & 0xffffffff;
      if (uVar7 < 0x29) {
        local_118 = CONCAT44(local_118._4_4_,(int)local_118 + 8);
        ppvVar6 = (void **)((long)local_e8 + uVar7);
      }
      else {
        ppvVar6 = local_110;
        local_110 = local_110 + 1;
      }
      if ((**ppvVar6 != lVar3) || (NAN(**ppvVar6) || NAN(lVar3))) {
        TEST_RESULTS = TEST_RESULTS + 1;
        uVar9 = 0x55;
        pcVar8 = "*( va_arg( ap, long double * ) ) == LDBL_MAX";
        goto LAB_00101570;
      }
      break;
    case 8:
      uVar7 = local_118 & 0xffffffff;
      if (uVar7 < 0x29) {
        local_118 = CONCAT44(local_118._4_4_,(int)local_118 + 8);
        ppvVar6 = (void **)((long)local_e8 + uVar7);
      }
      else {
        ppvVar6 = local_110;
        local_110 = local_110 + 1;
      }
      pcVar2 = (code *)*ppvVar6;
      if (pcVar2 != dummy) {
        TEST_RESULTS = TEST_RESULTS + 1;
        printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/stdarg.c, line %d - %s\n"
               ,0x5d,"( function = va_arg( ap, intfunc_t ) ) == dummy");
      }
      iVar4 = (*pcVar2)();
      if (iVar4 != 0x7fffffff) {
        TEST_RESULTS = TEST_RESULTS + 1;
        uVar9 = 0x5e;
        pcVar8 = "function() == INT_MAX";
        goto LAB_00101570;
      }
    }
    uVar7 = local_118 & 0xffffffff;
    if (uVar7 < 0x29) {
      local_118 = CONCAT44(local_118._4_4_,(int)local_118 + 8);
      ppvVar6 = (void **)((long)local_e8 + uVar7);
    }
    else {
      ppvVar6 = local_110;
      local_110 = local_110 + 1;
    }
    s = *(int *)ppvVar6;
  } while( true );
}

Assistant:

static int test( int s, ... )
{
    va_list ap;
    va_start( ap, s );

    for ( ;; )
    {
        switch ( s )
        {
            case TAG_INT:
            {
                TESTCASE( va_arg( ap, int ) == INT_MAX );
                s = va_arg( ap, int );
                break;
            }

            case TAG_LONG:
            {
                TESTCASE( va_arg( ap, long ) == LONG_MAX );
                s = va_arg( ap, int );
                break;
            }

            case TAG_LLONG:
            {
                TESTCASE( va_arg( ap, long long ) == LLONG_MAX );
                s = va_arg( ap, int );
                break;
            }

            case TAG_DBL:
            {
                TESTCASE( va_arg( ap, double ) == DBL_MAX );
                s = va_arg( ap, int );
                break;
            }

            case TAG_LDBL:
            {
                TESTCASE( va_arg( ap, long double ) == LDBL_MAX );
                s = va_arg( ap, int );
                break;
            }

            case TAG_INTPTR:
            {
                TESTCASE( *( va_arg( ap, int * ) ) == INT_MAX );
                s = va_arg( ap, int );
                break;
            }

            case TAG_LDBLPTR:
            {
                TESTCASE( *( va_arg( ap, long double * ) ) == LDBL_MAX );
                s = va_arg( ap, int );
                break;
            }

            case TAG_FUNCPTR:
            {
                intfunc_t function;
                TESTCASE( ( function = va_arg( ap, intfunc_t ) ) == dummy );
                TESTCASE( function() == INT_MAX );
                s = va_arg( ap, int );
                break;
            }

            case TAG_END:
            {
                va_end( ap );
                return 0;
            }
        }
    }
}